

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worn.c
# Opt level: O3

void mon_adjust_speed(monst *mon,int adjust,obj *obj)

{
  obj *poVar1;
  boolean bVar2;
  char *pcVar3;
  byte bVar4;
  uint uVar5;
  char *pcVar6;
  char *line;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  
  bVar8 = in_mklev == '\0';
  uVar5 = *(uint *)&mon->field_0x60;
  bVar9 = true;
  bVar4 = 0;
  switch(adjust) {
  default:
switchD_0028c1c0_caseD_0:
    uVar7 = uVar5;
    goto LAB_0028c267;
  case 1:
    uVar7 = (uVar5 & 0xffffcfff) + 0x2000;
    bVar9 = (uVar5 & 0x3000) == 0x1000;
LAB_0028c236:
    if (bVar9) {
      uVar7 = uVar5 & 0xffffcfff;
    }
    bVar9 = true;
    bVar4 = 0;
    goto LAB_0028c259;
  case 2:
    uVar7 = uVar5 & 0xffffcfff | 0x2000;
    break;
  case -3:
    if ((uVar5 & 0x3000) != 0x2000) {
      bVar4 = 1;
      bVar9 = false;
      goto switchD_0028c1c0_caseD_0;
    }
    uVar7 = uVar5 & 0xffffcfff;
    bVar4 = 1;
    bVar9 = false;
    goto LAB_0028c259;
  case -2:
    uVar7 = uVar5 & 0xffffcfff | 0x1000;
    break;
  case -1:
    uVar7 = (uVar5 & 0xffffcfff) + 0x1000;
    bVar9 = (uVar5 & 0x3000) == 0x2000;
    goto LAB_0028c236;
  }
  bVar9 = true;
  bVar4 = 0;
  bVar8 = false;
LAB_0028c259:
  *(uint *)&mon->field_0x60 = uVar7;
LAB_0028c267:
  for (poVar1 = mon->minvent; poVar1 != (obj *)0x0; poVar1 = poVar1->nobj) {
    if ((poVar1->owornmask != 0) && (objects[poVar1->otyp].oc_oprop == '\x1a')) {
      uVar7 = uVar7 & 0xfffff3ff | 0x800;
      goto LAB_0028c2be;
    }
  }
  uVar7 = uVar7 & 0xfffff3ff | uVar7 >> 2 & 0xc00;
LAB_0028c2be:
  *(uint *)&mon->field_0x60 = uVar7;
  if (!bVar8) {
    return;
  }
  uVar5 = uVar5 >> 10 & 3;
  if ((bool)(~bVar4 & (uVar7 >> 10 & 3) == uVar5)) {
    return;
  }
  if (mon->wormno != '\0') {
    bVar2 = worm_known(level,mon);
    if (bVar2 == '\0') {
      return;
    }
    uVar7 = *(uint *)&mon->field_0x60;
    goto LAB_0028c3bf;
  }
  if ((viz_array[mon->my][mon->mx] & 2U) != 0) goto LAB_0028c3bf;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0028c358;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0028c34f;
  }
  else {
LAB_0028c34f:
    if (ublindf == (obj *)0x0) {
      return;
    }
LAB_0028c358:
    if (ublindf->oartifact != '\x1d') {
      return;
    }
  }
  if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
     (((youmonst.data)->mflags3 & 0x100) == 0)) {
    return;
  }
  if ((viz_array[mon->my][mon->mx] & 1U) == 0) {
    return;
  }
  if ((mon->data->mflags3 & 0x200) == 0) {
    return;
  }
LAB_0028c3bf:
  if ((((uVar7 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar7 & 0x280) != 0) {
      return;
    }
  }
  else {
    if ((uVar7 & 0x280) != 0) {
      return;
    }
    if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
      return;
    }
  }
  if ((u._1052_1_ & 0x20) == 0) {
    uVar7 = uVar7 >> 10 & 3;
    pcVar6 = "";
    if (uVar5 + uVar7 == 3) {
      pcVar6 = "much ";
    }
    if (bVar9) {
      pcVar3 = Monnam(mon);
      if ((adjust < 1) && (uVar7 != 2)) {
        line = "%s seems to be moving %sslower.";
      }
      else {
        line = "%s is suddenly moving %sfaster.";
      }
      pline(line,pcVar3,pcVar6);
    }
    else if (flags.verbose != '\0') {
      pcVar6 = Monnam(mon);
      pline("%s is slowing down.",pcVar6);
    }
    if (obj != (obj *)0x0) {
      if ((obj->oprops & 0x20) == 0) {
        if (((obj->field_0x4a & 0x20) != 0) && (objects[obj->otyp].oc_class != '\n')) {
          discover_object((int)obj->otyp,'\x01','\x01');
          return;
        }
      }
      else {
        *(byte *)&obj->oprops_known = (byte)obj->oprops_known | 0x20;
      }
    }
  }
  return;
}

Assistant:

void mon_adjust_speed(struct monst *mon,
		      int adjust, /* positive => increase speed, negative => decrease */
		      struct obj *obj)	/* item to make known if effect can be seen */
{
    struct obj *otmp;
    boolean give_msg = !in_mklev, petrify = FALSE;
    unsigned int oldspeed = mon->mspeed;

    switch (adjust) {
     case  2:
	mon->permspeed = MFAST;
	give_msg = FALSE;	/* special case monster creation */
	break;
     case  1:
	if (mon->permspeed == MSLOW) mon->permspeed = 0;
	else mon->permspeed = MFAST;
	break;
     case  0:			/* just check for worn speed boots */
	break;
     case -1:
	if (mon->permspeed == MFAST) mon->permspeed = 0;
	else mon->permspeed = MSLOW;
	break;
     case -2:
	mon->permspeed = MSLOW;
	give_msg = FALSE;	/* (not currently used) */
	break;
     case -3:			/* petrification */
	/* take away intrinsic speed but don't reduce normal speed */
	if (mon->permspeed == MFAST) mon->permspeed = 0;
	petrify = TRUE;
	break;
    }

    for (otmp = mon->minvent; otmp; otmp = otmp->nobj)
	if (otmp->owornmask && objects[otmp->otyp].oc_oprop == FAST)
	    break;
    if (otmp)		/* speed boots */
	mon->mspeed = MFAST;
    else
	mon->mspeed = mon->permspeed;

    if (give_msg && (mon->mspeed != oldspeed || petrify) && canseemon(level, mon)) {
	/* fast to slow (skipping intermediate state) or vice versa */
	const char *howmuch = (mon->mspeed + oldspeed == MFAST + MSLOW) ?
				"much " : "";

	if (petrify) {
	    /* mimic the player's petrification countdown; "slowing down"
	       even if fast movement rate retained via worn speed boots */
	    if (flags.verbose) pline("%s is slowing down.", Monnam(mon));
	} else if (adjust > 0 || mon->mspeed == MFAST)
	    pline("%s is suddenly moving %sfaster.", Monnam(mon), howmuch);
	else
	    pline("%s seems to be moving %sslower.", Monnam(mon), howmuch);

	/* might discover an object if we see the speed change happen, but
	   avoid making possibly forgotten book known when casting its spell */
	if (obj) {
	    if (obj->oprops & ITEM_SPEED)
		obj->oprops_known |= ITEM_SPEED;
	    else if (obj->dknown && objects[obj->otyp].oc_class != SPBOOK_CLASS)
		makeknown(obj->otyp);
	}
    }
}